

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateOneAttribute
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr,xmlChar *value)

{
  int iVar1;
  uint uVar2;
  xmlChar **elem_00;
  xmlIDPtr pxVar3;
  xmlRefPtr pxVar4;
  xmlChar *local_b0;
  undefined8 *local_a8;
  xmlEnumerationPtr tree_1;
  xmlNotationPtr nota;
  xmlEnumerationPtr tree;
  xmlChar *fullname;
  xmlChar fn [50];
  int ret;
  int val;
  xmlChar *aprefix;
  xmlAttributePtr attrDecl;
  xmlChar *value_local;
  xmlAttrPtr attr_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  aprefix = (xmlChar *)0x0;
  stack0xffffffffffffffb0 = 1;
  if (doc == (xmlDocPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if ((elem == (xmlNodePtr)0x0) || (elem->name == (xmlChar *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if ((attr == (xmlAttrPtr)0x0) || (attr->name == (xmlChar *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if (attr->ns == (xmlNs *)0x0) {
      local_b0 = (xmlChar *)0x0;
    }
    else {
      local_b0 = attr->ns->prefix;
    }
    if ((elem->ns != (xmlNs *)0x0) && (elem->ns->prefix != (xmlChar *)0x0)) {
      elem_00 = (xmlChar **)xmlBuildQName(elem->name,elem->ns->prefix,(xmlChar *)&fullname,0x32);
      if (elem_00 == (xmlChar **)0x0) {
        xmlVErrMemory(ctxt);
        return 0;
      }
      aprefix = (xmlChar *)xmlGetDtdQAttrDesc(doc->intSubset,(xmlChar *)elem_00,attr->name,local_b0)
      ;
      if (((xmlAttributePtr)aprefix == (xmlAttributePtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0))
      {
        aprefix = (xmlChar *)
                  xmlGetDtdQAttrDesc(doc->extSubset,(xmlChar *)elem_00,attr->name,local_b0);
      }
      if ((elem_00 != &fullname) && (elem_00 != (xmlChar **)elem->name)) {
        (*xmlFree)(elem_00);
      }
    }
    if (((aprefix == (xmlChar *)0x0) &&
        (aprefix = (xmlChar *)xmlGetDtdQAttrDesc(doc->intSubset,elem->name,attr->name,local_b0),
        (xmlAttributePtr)aprefix == (xmlAttributePtr)0x0)) && (doc->extSubset != (_xmlDtd *)0x0)) {
      aprefix = (xmlChar *)xmlGetDtdQAttrDesc(doc->extSubset,elem->name,attr->name,local_b0);
    }
    if (aprefix == (xmlChar *)0x0) {
      xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,
                      "No declaration for attribute %s of element %s\n",attr->name,elem->name,
                      (xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
    }
    else {
      if (attr->atype == XML_ATTRIBUTE_ID) {
        xmlRemoveID(doc,attr);
      }
      attr->atype = *(xmlAttributeType *)(aprefix + 0x50);
      iVar1 = xmlValidateAttributeValueInternal(doc,*(xmlAttributeType *)(aprefix + 0x50),value);
      if (iVar1 == 0) {
        xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                        "Syntax of value for attribute %s of %s is not valid\n",attr->name,
                        elem->name,(xmlChar *)0x0);
        stack0xffffffffffffffb0 = 0;
      }
      if ((*(int *)(aprefix + 0x54) == 4) &&
         (iVar1 = xmlStrEqual(value,*(xmlChar **)(aprefix + 0x58)), iVar1 == 0)) {
        xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,
                        "Value for attribute %s of %s is different from default \"%s\"\n",attr->name
                        ,elem->name,*(xmlChar **)(aprefix + 0x58));
        stack0xffffffffffffffb0 = 0;
      }
      if ((*(int *)(aprefix + 0x50) == 2) &&
         (pxVar3 = xmlAddID(ctxt,doc,value,attr), pxVar3 == (xmlIDPtr)0x0)) {
        stack0xffffffffffffffb0 = 0;
      }
      if (((*(int *)(aprefix + 0x50) == 3) || (*(int *)(aprefix + 0x50) == 4)) &&
         (pxVar4 = xmlAddRef(ctxt,doc,value,attr), pxVar4 == (xmlRefPtr)0x0)) {
        stack0xffffffffffffffb0 = 0;
      }
      if (*(int *)(aprefix + 0x50) == 10) {
        nota = *(xmlNotationPtr *)(aprefix + 0x60);
        tree_1 = (xmlEnumerationPtr)xmlGetDtdNotationDesc(doc->intSubset,value);
        if ((xmlNotationPtr)tree_1 == (xmlNotationPtr)0x0) {
          tree_1 = (xmlEnumerationPtr)xmlGetDtdNotationDesc(doc->extSubset,value);
        }
        if (tree_1 == (xmlEnumerationPtr)0x0) {
          xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,
                          "Value \"%s\" for attribute %s of %s is not a declared Notation\n",value,
                          attr->name,elem->name);
          stack0xffffffffffffffb0 = 0;
        }
        while ((nota != (xmlNotationPtr)0x0 &&
               (iVar1 = xmlStrEqual(nota->PublicID,value), iVar1 == 0))) {
          nota = (xmlNotationPtr)nota->name;
        }
        if (nota == (xmlNotationPtr)0x0) {
          xmlErrValidNode(ctxt,elem,XML_DTD_NOTATION_VALUE,
                          "Value \"%s\" for attribute %s of %s is not among the enumerated notations\n"
                          ,value,attr->name,elem->name);
          stack0xffffffffffffffb0 = 0;
        }
      }
      if (*(int *)(aprefix + 0x50) == 9) {
        local_a8 = *(undefined8 **)(aprefix + 0x60);
        while ((local_a8 != (undefined8 *)0x0 &&
               (iVar1 = xmlStrEqual((xmlChar *)local_a8[1],value), iVar1 == 0))) {
          local_a8 = (undefined8 *)*local_a8;
        }
        if (local_a8 == (undefined8 *)0x0) {
          xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                          "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
                          value,attr->name,elem->name);
          stack0xffffffffffffffb0 = 0;
        }
      }
      if ((*(int *)(aprefix + 0x54) == 4) &&
         (iVar1 = xmlStrEqual(*(xmlChar **)(aprefix + 0x58),value), iVar1 == 0)) {
        xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                        "Value for attribute %s of %s must be \"%s\"\n",attr->name,elem->name,
                        *(xmlChar **)(aprefix + 0x58));
        stack0xffffffffffffffb0 = 0;
      }
      uVar2 = xmlValidateAttributeValue2
                        (ctxt,doc,attr->name,*(xmlAttributeType *)(aprefix + 0x50),value);
      ctxt_local._4_4_ = uVar2 & stack0xffffffffffffffb0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateOneAttribute(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                        xmlNodePtr elem, xmlAttrPtr attr, const xmlChar *value)
{
    xmlAttributePtr attrDecl =  NULL;
    const xmlChar *aprefix;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((attr == NULL) || (attr->name == NULL)) return(0);

    aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL) {
            xmlVErrMemory(ctxt);
	    return(0);
        }
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
                                          attr->name, aprefix);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
                                          attr->name, aprefix);
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
	       "No declaration for attribute %s of element %s\n",
	       attr->name, elem->name, NULL);
	return(0);
    }
    if (attr->atype == XML_ATTRIBUTE_ID)
        xmlRemoveID(doc, attr);
    attr->atype = attrDecl->atype;

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Syntax of value for attribute %s of %s is not valid\n",
	       attr->name, elem->name, NULL);
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
	   "Value for attribute %s of %s is different from default \"%s\"\n",
		   attr->name, elem->name, attrDecl->defaultValue);
	    ret = 0;
	}
    }

    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute %s of %s is not a declared Notation\n",
		   value, attr->name, elem->name);
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute %s of %s is not among the enumerated notations\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
       "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Value for attribute %s of %s must be \"%s\"\n",
	       attr->name, elem->name, attrDecl->defaultValue);
        ret = 0;
    }

    /* Extra check for the attribute value */
    ret &= xmlValidateAttributeValue2(ctxt, doc, attr->name,
				      attrDecl->atype, value);

    return(ret);
}